

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetTestPropertyCommand.cxx
# Opt level: O0

bool cmGetTestPropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmValue this;
  size_type this_00;
  bool bVar1;
  const_reference pvVar2;
  const_reference name;
  cmMakefile *this_01;
  ulong uVar3;
  string_view local_e0;
  string *local_d0;
  string *local_c8;
  cmValue local_c0;
  cmValue prop;
  cmTest *test;
  cmMakefile *mf;
  string *var;
  string *testName;
  cmMakefile *pcStack_90;
  bool file_scopes_handled;
  cmMakefile *test_directory_makefile;
  int var_arg_index;
  bool test_directory_option_enabled;
  string test_directory;
  allocator<char> local_49;
  string local_48;
  size_type local_28;
  size_type args_size;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  args_size = (size_type)status;
  status_local = (cmExecutionStatus *)args;
  local_28 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(args);
  this_00 = args_size;
  if ((local_28 != 3) && (local_28 != 5)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmExecutionStatus::SetError((cmExecutionStatus *)this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    args_local._7_1_ = 0;
    goto LAB_008008b1;
  }
  std::__cxx11::string::string((string *)&var_arg_index);
  test_directory_makefile._7_1_ = 0;
  test_directory_makefile._0_4_ = 2;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,2);
  bVar1 = std::operator==(pvVar2,"DIRECTORY");
  if ((bVar1) && (local_28 == 5)) {
    test_directory_makefile._0_4_ = 4;
    test_directory_makefile._7_1_ = 1;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,3);
    std::__cxx11::string::operator=((string *)&var_arg_index,(string *)pvVar2);
  }
  pcStack_90 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)args_size);
  bVar1 = SetPropertyCommand::HandleAndValidateTestDirectoryScopes
                    ((cmExecutionStatus *)args_size,(bool)(test_directory_makefile._7_1_ & 1),
                     (string *)&var_arg_index,&stack0xffffffffffffff70);
  if (bVar1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,0);
    name = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,(long)(int)test_directory_makefile);
    this_01 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)args_size);
    prop.Value = (string *)cmMakefile::GetTest(pcStack_90,pvVar2);
    if ((cmTest *)prop.Value != (cmTest *)0x0) {
      cmValue::cmValue(&local_c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local,1);
      uVar3 = std::__cxx11::string::empty();
      this = prop;
      if ((uVar3 & 1) == 0) {
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,1);
        local_c8 = (string *)cmTest::GetProperty(this.Value,pvVar2);
        local_c0 = (cmValue)local_c8;
      }
      bVar1 = cmValue::operator_cast_to_bool(&local_c0);
      if (bVar1) {
        local_d0 = local_c0.Value;
        cmMakefile::AddDefinition(this_01,name,local_c0);
        args_local._7_1_ = 1;
        goto LAB_008008a8;
      }
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e0,"NOTFOUND");
    cmMakefile::AddDefinition(this_01,name,local_e0);
    args_local._7_1_ = 1;
  }
  else {
    args_local._7_1_ = 0;
  }
LAB_008008a8:
  std::__cxx11::string::~string((string *)&var_arg_index);
LAB_008008b1:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmGetTestPropertyCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  std::vector<std::string>::size_type args_size = args.size();
  if (args_size != 3 && args_size != 5) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  std::string test_directory;
  bool test_directory_option_enabled = false;

  int var_arg_index = 2;
  if (args[2] == "DIRECTORY" && args_size == 5) {
    var_arg_index = 4;
    test_directory_option_enabled = true;
    test_directory = args[3];
  }

  cmMakefile* test_directory_makefile = &status.GetMakefile();
  bool file_scopes_handled =
    SetPropertyCommand::HandleAndValidateTestDirectoryScopes(
      status, test_directory_option_enabled, test_directory,
      test_directory_makefile);
  if (!file_scopes_handled) {
    return false;
  }

  std::string const& testName = args[0];
  std::string const& var = args[var_arg_index];
  cmMakefile& mf = status.GetMakefile();
  cmTest* test = test_directory_makefile->GetTest(testName);
  if (test) {
    cmValue prop;
    if (!args[1].empty()) {
      prop = test->GetProperty(args[1]);
    }
    if (prop) {
      mf.AddDefinition(var, prop);
      return true;
    }
  }
  mf.AddDefinition(var, "NOTFOUND");
  return true;
}